

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wf.h
# Opt level: O0

void __thiscall trieste::wf::Fields::gen(Fields *this,Gen *g,size_t depth,Node *node)

{
  bool bVar1;
  Choice *this_00;
  element_type *this_01;
  element_type *peVar2;
  __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_02;
  Location *pLVar3;
  socklen_t __len;
  shared_ptr<trieste::NodeDef> *this_03;
  sockaddr *__addr;
  shared_ptr<trieste::NodeDef> local_58;
  reference local_48;
  Field *field;
  const_iterator __end2;
  const_iterator __begin2;
  vector<trieste::wf::Field,_std::allocator<trieste::wf::Field>_> *__range2;
  Node *node_local;
  size_t depth_local;
  Gen *g_local;
  Fields *this_local;
  
  __end2._M_current =
       (Field *)std::vector<trieste::wf::Field,_std::allocator<trieste::wf::Field>_>::begin
                          (&this->fields);
  field = (Field *)std::vector<trieste::wf::Field,_std::allocator<trieste::wf::Field>_>::end
                             (&this->fields);
  while (bVar1 = __gnu_cxx::
                 operator==<const_trieste::wf::Field_*,_std::vector<trieste::wf::Field,_std::allocator<trieste::wf::Field>_>_>
                           (&__end2,(__normal_iterator<const_trieste::wf::Field_*,_std::vector<trieste::wf::Field,_std::allocator<trieste::wf::Field>_>_>
                                     *)&field), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_48 = __gnu_cxx::
               __normal_iterator<const_trieste::wf::Field_*,_std::vector<trieste::wf::Field,_std::allocator<trieste::wf::Field>_>_>
               ::operator*(&__end2);
    this_00 = &local_48->choice;
    this_03 = &local_58;
    std::shared_ptr<trieste::NodeDef>::shared_ptr(this_03,node);
    Choice::gen(this_00,g,depth,this_03);
    __len = (socklen_t)this_03;
    std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_58);
    bVar1 = Token::operator==(&this->binding,&local_48->name);
    if (bVar1) {
      this_01 = std::__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)node);
      peVar2 = std::__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)node);
      this_02 = (__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                NodeDef::back(peVar2);
      peVar2 = std::__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(this_02);
      pLVar3 = NodeDef::location(peVar2);
      NodeDef::bind(this_01,(int)pLVar3,__addr,__len);
    }
    __gnu_cxx::
    __normal_iterator<const_trieste::wf::Field_*,_std::vector<trieste::wf::Field,_std::allocator<trieste::wf::Field>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void gen(Gen& g, size_t depth, Node node) const
      {
        for (auto& field : fields)
        {
          field.choice.gen(g, depth, node);

          if (binding == field.name)
            node->bind(node->back()->location());
        }
      }